

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PrimitiveInstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PrimitiveInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::PrimitiveSymbol_const&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,PrimitiveSymbol *args_2)

{
  string_view name;
  PrimitiveInstanceSymbol *pPVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pPVar1 = (PrimitiveInstanceSymbol *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  slang::ast::PrimitiveInstanceSymbol::PrimitiveInstanceSymbol
            (*(PrimitiveInstanceSymbol **)(in_RSI + 8),name,in_RCX,*(PrimitiveSymbol **)in_RSI);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }